

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ButtonUI.cpp
# Opt level: O2

void __thiscall nite::ButtonUI::render(ButtonUI *this,Vec2 *offset)

{
  Vec2 *this_00;
  bool bVar1;
  int iVar2;
  RenderableFont *pRVar3;
  RenderableTextureT *pRVar4;
  float fVar5;
  float fVar6;
  undefined1 auStack_98 [8];
  Color bc;
  undefined1 auStack_78 [8];
  Color tc;
  Vec2 local_58;
  Vec2 rp;
  Vec2 cs;
  Vec2 is;
  undefined1 local_38 [8];
  Vec2 p;
  
  if (render(nite::Vec2_const&)::blank == '\0') {
    iVar2 = __cxa_guard_acquire(&render(nite::Vec2_const&)::blank);
    if (iVar2 != 0) {
      std::__cxx11::string::string
                ((string *)auStack_98,"data/texture/empty.png",(allocator *)auStack_78);
      Texture::Texture(&render::blank,(string *)auStack_98);
      std::__cxx11::string::~string((string *)auStack_98);
      __cxa_atexit(Texture::~Texture,&render::blank,&__dso_handle);
      __cxa_guard_release(&render(nite::Vec2_const&)::blank);
    }
  }
  Vec2::Vec2((Vec2 *)local_38,(this->super_BaseUIComponent).position.x + offset->x,
             (this->super_BaseUIComponent).position.y + offset->y);
  this_00 = &(this->super_BaseUIComponent).size;
  Vec2::operator+(this_00,&(this->super_BaseUIComponent).padding);
  Color::Color((Color *)auStack_98,&this->baseColor);
  Color::Color((Color *)auStack_78,&this->textColor);
  iVar2 = this->buttonState;
  if (iVar2 == 1) {
    Color::operator*((Color *)&cs,0.5);
    Color::operator*((Color *)&cs,0.5);
    iVar2 = this->buttonState;
  }
  if (iVar2 == 2) {
    Color::operator*((Color *)&cs,1.0);
    Color::operator*((Color *)&cs,1.0);
  }
  Vec2::operator*(&local_58,0.5);
  fVar5 = (this->secondColor).a;
  if ((fVar5 != 0.0) || (NAN(fVar5))) {
    Color::Color((Color *)&cs,&this->secondColor);
  }
  else {
    Color::operator*((Color *)&cs,0.95);
  }
  setColor((Color *)&cs);
  Texture::draw(&render::blank,(float)local_38._0_4_ - local_58.x,(float)local_38._4_4_ - local_58.y
                ,rp.x,rp.y,0.0,0.0,0.0);
  setColor((Color *)auStack_98);
  fVar5 = (this->borderThickness).x;
  fVar6 = (this->borderThickness).y;
  Texture::draw(&render::blank,((float)local_38._0_4_ - local_58.x) + fVar5,
                ((float)local_38._4_4_ - local_58.y) + fVar6,rp.x - (fVar5 + fVar5),
                rp.y - (fVar6 + fVar6),0.0,0.0,0.0);
  bVar1 = Texture::isLoaded(&this->buttonImage);
  if (bVar1) {
    fVar5 = Vec2::avg(this_00);
    Texture::getSize((Texture *)&cs);
    while( true ) {
      fVar6 = Vec2::avg(&cs);
      if (fVar6 <= fVar5 * 0.65) break;
      cs.x = cs.x * 0.9;
      cs.y = cs.y * 0.9;
    }
    setColor((Color *)auStack_78);
    pRVar4 = Texture::draw(&this->buttonImage,(float)local_38._0_4_,
                           cs.y * -0.09 + (float)local_38._4_4_,cs.x,cs.y,0.5,0.5,0.0);
    if (pRVar4 != (RenderableTextureT *)0x0) {
      pRVar4->smooth = true;
    }
  }
  else {
    setColor((Color *)auStack_78);
    pRVar3 = Font::draw(&this->font,&this->text,(float)local_38._0_4_,(float)local_38._4_4_,0.5,0.35
                        ,0.0);
    if (pRVar3 != (RenderableFont *)0x0) {
      pRVar3->shadow = false;
    }
  }
  return;
}

Assistant:

void nite::ButtonUI::render(const nite::Vec2 &offset){
    static nite::Texture blank("data/texture/empty.png");
    nite::Vec2 p(position.x + offset.x, position.y + offset.y);
    // nite::print(padding);
    auto cs = size + padding;
    nite::Color bc = baseColor;
    nite::Color tc = textColor;
    if(buttonState == 1){
        bc = baseColor * 0.5f;
        tc = textColor * 0.5f;
    }
    if(buttonState == 2){
        bc = baseColor * 1.0f;
        tc = textColor * 1.0f;
    }
    nite::Vec2 &bt = borderThickness;
    nite::Vec2 rp(cs * 0.5f);
    //   nite::setColor(nite::Color(0.0f, 0.5f));
    //   blank.draw(p.x - rp.x + 3.0f, p.y - rp.y + 3.0f, cs.x, cs.y, 0.0f, 0.0f, 0.0f);
    nite::setColor(secondColor.a == 0.0f ? baseColor * 0.95f : secondColor);  
    blank.draw(p.x - rp.x, p.y - rp.y, cs.x, cs.y, 0.0f, 0.0f, 0.0f);
    nite::setColor(bc);  
    blank.draw(p.x - rp.x + bt.x, p.y - rp.y + bt.y, cs.x - bt.x * 2.0f, cs.y - bt.y * 2.0f, 0.0f, 0.0f, 0.0f);
    //   blank.draw(p.x - rp.x, p.y - rp.y, cs.x, cs.y, 0.0f, 0.0f, 0.0f);  

    if(!buttonImage.isLoaded()){
        nite::setColor(tc);  
        auto *ref = font.draw(text, p.x, p.y, 0.5f, 0.35f, 0.0f);
        if(ref != NULL){
            ref->shadow = false;
            // nite::Color sc = bc.invert();
            // ref->setShadow(nite::Color(sc.r, sc.g, sc.b, 1.0f), nite::Vec2(1.0f));
        }  	
    }else{
        auto total = size.avg() * 0.65f;
        nite::Vec2 is(buttonImage.getSize());
        while(is.avg() > total){
            is.x *= 0.90f;
            is.y *= 0.90f;
        }
        nite::setColor(tc); 
        auto *ref = buttonImage.draw(p.x, p.y - is.y * 0.09f, is.x, is.y, 0.5f, 0.5f, 0.0f);
        if(ref != NULL){
            ref->smooth = true;
        }
    }
}